

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::SuffixOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  unsigned_long *puVar1;
  long lVar2;
  data_t dVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 auStack_34 [4];
  undefined1 *local_30;
  undefined8 local_28;
  ulong local_20;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  puVar1 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if (((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) ||
     ((puVar1 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar1 != (unsigned_long *)0x0 && ((*puVar1 & 1) == 0)))) {
    ConstantVector::SetNull(result,true);
    return;
  }
  local_28 = *(ulong *)left->data;
  local_20 = *(ulong *)((long)left->data + 8);
  uVar6 = *(ulong *)right->data;
  local_30 = *(undefined1 **)((long)right->data + 8);
  uVar5 = (uint)uVar6;
  if (uVar5 <= (uint)local_28) {
    if (uVar5 < 0xd) {
      local_30 = auStack_34;
    }
    if ((uint)local_28 < 0xd) {
      local_20 = (long)&local_28 + 4;
    }
    uVar6 = uVar6 & 0xffffffff;
    pcVar4 = (char *)(local_20 + (local_28 & 0xffffffff));
    do {
      pcVar4 = pcVar4 + -1;
      if ((int)uVar6 < 1) {
        dVar3 = '\x01';
        goto LAB_0110fc39;
      }
      lVar2 = uVar6 - 1;
      uVar6 = uVar6 - 1;
    } while (local_30[lVar2] == *pcVar4);
  }
  dVar3 = '\0';
LAB_0110fc39:
  *result->data = dVar3;
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}